

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

void __thiscall
spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul>::
SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,4ul>
          (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *this,
          TypedID<(spirv_cross::Types)0> (*init) [4])

{
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>>
            ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,8ul> *)this,*init,init[1]);
  return;
}

Assistant:

explicit SmallVector(const U (&init)[M]) SPIRV_CROSS_NOEXCEPT : SmallVector(init, init + M)
	{
	}